

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O0

void helicsAppLoadFile(HelicsApp app,char *configFile,HelicsError *err)

{
  App *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  App *happ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  HelicsApp in_stack_ffffffffffffff98;
  bool local_42;
  allocator<char> local_41;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  string *in_stack_ffffffffffffffc8;
  App *in_stack_ffffffffffffffd0;
  
  pAVar1 = getApp(in_stack_ffffffffffffff98,(HelicsError *)in_stack_ffffffffffffff90);
  if (pAVar1 != (App *)0x0) {
    local_42 = in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_42) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffd0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffc8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffff90 = in_RSI;
    }
    local_42 = !local_42;
    helics::apps::App::loadFile
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
    std::__cxx11::string::~string(in_stack_ffffffffffffff90);
    if (local_42) {
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

void helicsAppLoadFile(HelicsApp app, const char* configFile, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return;
    }
    try {
        happ->loadFile(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}